

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O2

int * Vec_MemHashLookup(Vec_Mem_t *p,word *pEntry)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  word *__s1;
  ulong uVar4;
  ulong uVar5;
  Vec_Int_t *p_00;
  
  p_00 = p->vTable;
  uVar1 = p->nEntrySize * 2;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  uVar1 = 0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = uVar1 + *(int *)(Vec_MemHashKey_s_Primes + (ulong)((uint)uVar5 & 7) * 4) *
                    *(int *)((long)pEntry + uVar5 * 4);
  }
  uVar4 = (ulong)uVar1 % (ulong)(uint)p_00->nSize;
  while( true ) {
    puVar3 = (uint *)Vec_IntEntryP(p_00,(int)uVar4);
    if (*puVar3 == 0xffffffff) {
      return (int *)puVar3;
    }
    __s1 = Vec_MemReadEntry(p,*puVar3);
    iVar2 = bcmp(__s1,pEntry,(long)p->nEntrySize << 3);
    if (iVar2 == 0) break;
    p_00 = p->vNexts;
    uVar4 = (ulong)*puVar3;
  }
  return (int *)puVar3;
}

Assistant:

static int * Vec_MemHashLookup( Vec_Mem_t * p, word * pEntry )
{
    int * pSpot = Vec_IntEntryP( p->vTable, Vec_MemHashKey(p, pEntry) );
    for ( ; *pSpot != -1; pSpot = Vec_IntEntryP(p->vNexts, *pSpot) )
        if ( !memcmp( Vec_MemReadEntry(p, *pSpot), pEntry, sizeof(word) * p->nEntrySize ) ) // equal
            return pSpot;
    return pSpot;
}